

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gbs_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Gbs_Emu::start_track_(Gbs_Emu *this,int track)

{
  Gb_Cpu *this_00;
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  blargg_err_t pcVar4;
  blargg_err_t pcVar5;
  int i;
  long lVar6;
  
  pcVar4 = Classic_Emu::start_track_(&this->super_Classic_Emu,track);
  if (pcVar4 == (blargg_err_t)0x0) {
    lVar6 = 0;
    memset(this->ram,0,0x4000);
    memset(this->ram + 0x4000,0xff,0x1f80);
    memset(this->ram + 0x5f80,0,0x88);
    this->ram[0x5f00] = '\0';
    Gb_Apu::reset(&this->apu);
    do {
      Gb_Apu::write_register(&this->apu,0,(int)lVar6 + 0xff10,(uint)sound_data[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x30);
    uVar1 = *(ushort *)(this->header_).load_addr;
    Rom_Data_::set_addr_(&(this->rom).super_Rom_Data_,(ulong)uVar1,0x4000);
    this_00 = &this->super_Gb_Cpu;
    (this->super_Gb_Cpu).rst_base = (uint)uVar1;
    Gb_Cpu::reset(this_00,(this->rom).super_Rom_Data_.rom.begin_);
    Gb_Cpu::map_code(this_00,0xa000,0x6000,this->ram);
    pcVar4 = (blargg_err_t)0x0;
    uVar2 = -(this->rom).super_Rom_Data_.rom_addr;
    pcVar5 = (blargg_err_t)(ulong)uVar2;
    if ((int)(this->rom).super_Rom_Data_.rom.size_ - 0x4008U < uVar2) {
      pcVar5 = pcVar4;
    }
    Gb_Cpu::map_code(this_00,0,0x4000,pcVar5 + (long)(this->rom).super_Rom_Data_.rom.begin_);
    set_bank(this,(uint)(0x4000 < (this->rom).super_Rom_Data_.size_));
    bVar3 = (this->header_).timer_mode;
    this->ram[0x5f06] = (this->header_).timer_modulo;
    this->ram[0x5f07] = bVar3;
    update_timer(this);
    this->next_play = this->play_period;
    (this->super_Gb_Cpu).r.super_core_regs_t.a = (uint8_t)track;
    (this->super_Gb_Cpu).r.pc = 0xf00d;
    (this->super_Gb_Cpu).r.sp = *(uint16_t *)(this->header_).stack_ptr;
    this->cpu_time = 0;
    cpu_jsr(this,(uint)*(ushort *)(this->header_).init_addr);
  }
  return pcVar4;
}

Assistant:

blargg_err_t Gbs_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	
	memset( ram, 0, 0x4000 );
	memset( ram + 0x4000, 0xFF, 0x1F80 );
	memset( ram + 0x5F80, 0, sizeof ram - 0x5F80 );
	ram [hi_page] = 0; // joypad reads back as 0
	
	apu.reset();
	for ( int i = 0; i < (int) sizeof sound_data; i++ )
		apu.write_register( 0, i + apu.start_addr, sound_data [i] );
	
	unsigned load_addr = get_le16( header_.load_addr );
	rom.set_addr( load_addr );
	cpu::rst_base = load_addr;
	
	cpu::reset( rom.unmapped() );
	
	cpu::map_code( ram_addr, 0x10000 - ram_addr, ram );
	cpu::map_code( 0, bank_size, rom.at_addr( 0 ) );
	set_bank( rom.size() > bank_size );
	
	ram [hi_page + 6] = header_.timer_modulo;
	ram [hi_page + 7] = header_.timer_mode;
	update_timer();
	next_play = play_period;
	
	cpu::r.a  = track;
	cpu::r.pc = idle_addr;
	cpu::r.sp = get_le16( header_.stack_ptr );
	cpu_time  = 0;
	cpu_jsr( get_le16( header_.init_addr ) );
	
	return 0;
}